

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneloader.h
# Opt level: O3

void load_scene_json(Scene *scene,string *json)

{
  pointer *pppTVar1;
  pointer ppOVar2;
  iterator __position;
  bool bVar3;
  reference pvVar4;
  Camera *pCVar5;
  reference pbVar6;
  Triangle *pTVar7;
  ostream *poVar8;
  vector<Object_*,_std::allocator<Object_*>_> *__range1;
  pointer ppOVar9;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  obj;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  u;
  iterator __begin1;
  string tmp;
  iterator __end1;
  stringstream buffer;
  ifstream t;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_448;
  _Any_data local_428;
  code *pcStack_418;
  undefined8 uStack_410;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_400;
  long local_3f8;
  char local_3f0 [16];
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_3e0;
  stringstream local_3c0 [16];
  undefined1 local_3b0 [112];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  streambuf local_228 [504];
  
  std::ifstream::ifstream(local_238,(string *)json,_S_in);
  std::__cxx11::stringstream::stringstream(local_3c0);
  std::ostream::operator<<(local_3b0,local_228);
  std::__cxx11::stringbuf::str();
  nlohmann::detail::input_adapter::
  input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            ((input_adapter *)&local_448,local_400,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_400._M_current + local_3f8));
  local_428._M_unused._M_object = (void *)0x0;
  local_428._8_8_ = 0;
  pcStack_418 = (code *)0x0;
  uStack_410 = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)local_458,(input_adapter *)&local_448,(parser_callback_t *)&local_428,true);
  if (pcStack_418 != (code *)0x0) {
    (*pcStack_418)(&local_428,&local_428,__destroy_functor);
  }
  if (local_448.m_it.object_iterator._M_node != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_448.m_it.object_iterator._M_node);
  }
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_458,"cam");
  pCVar5 = json_parse_camera<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                     (pvVar4);
  scene->camera = pCVar5;
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_458,"obj");
  local_448.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_448.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_448.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_448.m_object = pvVar4;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_begin(&local_448);
  local_3e0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_3e0.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_3e0.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_3e0.m_object = pvVar4;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_end(&local_3e0);
  while( true ) {
    bVar3 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==(&local_448,&local_3e0);
    if (bVar3) break;
    pbVar6 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator*(&local_448);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_468,pbVar6);
    json_parse_object<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              ((vector<Object_*,_std::allocator<Object_*>_> *)scene,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_468);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_468);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_468 + 8),local_468[0]);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++(&local_448);
  }
  pTVar7 = (Triangle *)
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_458,"light");
  local_448.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_448.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_448.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_448.m_object = (pointer)pTVar7;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_begin(&local_448);
  local_3e0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_3e0.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_3e0.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_3e0.m_object = (pointer)pTVar7;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_end(&local_3e0);
  while( true ) {
    bVar3 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==(&local_448,&local_3e0);
    if (bVar3) break;
    pbVar6 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator*(&local_448);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_468,pbVar6);
    json_parse_light<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (scene,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_468);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_468);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_468 + 8),local_468[0]);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++(&local_448);
  }
  ppOVar9 = (scene->group).obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppOVar2 = (scene->group).obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppOVar9 != ppOVar2) {
    do {
      pTVar7 = (Triangle *)*ppOVar9;
      if ((pTVar7->super_Object).remit == 1) {
        __position._M_current =
             (scene->triangle_lights).super__Vector_base<Triangle_*,_std::allocator<Triangle_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_448.m_object = (pointer)pTVar7;
        if (__position._M_current ==
            (scene->triangle_lights).super__Vector_base<Triangle_*,_std::allocator<Triangle_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Triangle*,std::allocator<Triangle*>>::_M_realloc_insert<Triangle*>
                    ((vector<Triangle*,std::allocator<Triangle*>> *)&scene->triangle_lights,
                     __position,(Triangle **)&local_448);
        }
        else {
          *__position._M_current = pTVar7;
          pppTVar1 = &(scene->triangle_lights).
                      super__Vector_base<Triangle_*,_std::allocator<Triangle_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
        scene->lights_area = pTVar7->area + scene->lights_area;
      }
      ppOVar9 = ppOVar9 + 1;
    } while (ppOVar9 != ppOVar2);
  }
  poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,cntt);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"|",1);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  Group::reset_obj(&scene->group);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_458);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_458 + 8),(value_t)local_458[0]);
  if (local_400._M_current != local_3f0) {
    operator_delete(local_400._M_current);
  }
  std::__cxx11::stringstream::~stringstream(local_3c0);
  std::ios_base::~ios_base(local_340);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void load_scene_json(Scene& scene,std::string json)
{
	std::ifstream t(json);
	std::stringstream buffer;
	buffer << t.rdbuf();
	std::string tmp = buffer.str();
	auto u = json::parse(tmp);
	scene.camera = json_parse_camera(u["cam"]);
	for (auto obj : u["obj"])
		json_parse_object(scene.group.obj, obj);
	for (auto obj : u["light"])
		json_parse_light(scene,obj);
	for (auto obj : scene.group.obj)
		if (obj->remit==1)
			scene.triangle_lights.push_back((Triangle*)obj),
			scene.lights_area+=((Triangle*)obj)->area;
	std::cerr << cntt << "|"<<scene.point_lights.size() << ","<<scene.point_lights_decay.size()<<","<<scene.triangle_lights.size()<<"\n";
	scene.group.reset_obj();
}